

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkConvertBlackboxes(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  void **ppvVar2;
  int iVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int iVar7;
  long lVar8;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x25c,"Abc_Ntk_t *Abc_NtkConvertBlackboxes(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] == 0) {
    pNtk_00 = Abc_NtkAlloc(ABC_NTK_NETLIST,pNtk->ntkFunc,1);
    pcVar4 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar4;
    pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_00->pSpec = pcVar4;
    Abc_NtkCleanCopy(pNtk);
    Abc_NtkIncrementTravId(pNtk);
    for (iVar7 = 0; iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
      pAVar5 = Abc_NtkBox(pNtk,iVar7);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 10) {
        Abc_NodeSetTravIdCurrent(pAVar5);
      }
    }
    for (iVar7 = 0; iVar7 < pNtk->vCis->nSize; iVar7 = iVar7 + 1) {
      pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vCis,iVar7);
      Abc_NodeSetTravIdCurrent(pAVar5);
    }
    for (iVar7 = 0; iVar7 < pNtk->vCos->nSize; iVar7 = iVar7 + 1) {
      pAVar5 = Abc_NtkCo(pNtk,iVar7);
      Abc_NodeSetTravIdCurrent(pAVar5);
    }
    for (iVar7 = 0; iVar7 < pNtk->vPis->nSize; iVar7 = iVar7 + 1) {
      pAVar5 = Abc_NtkPi(pNtk,iVar7);
      Abc_NodeSetTravIdPrevious(pAVar5);
    }
    for (iVar7 = 0; iVar3 = pNtk->vBoxes->nSize, iVar7 < iVar3; iVar7 = iVar7 + 1) {
      pAVar5 = Abc_NtkBox(pNtk,iVar7);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
        pAVar5 = Abc_NtkBox(pNtk,iVar7);
        Abc_NodeSetTravIdPrevious
                  ((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
      }
    }
    for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
      pAVar5 = Abc_NtkBox(pNtk,iVar7);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
        pAVar5 = Abc_NtkBox(pNtk,iVar7);
        Abc_NodeSetTravIdPrevious
                  ((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray]);
      }
      iVar3 = pNtk->vBoxes->nSize;
    }
    for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
      pAVar5 = Abc_NtkBox(pNtk,iVar7);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 10) {
        for (lVar8 = 0; lVar8 < (pAVar5->vFanouts).nSize; lVar8 = lVar8 + 1) {
          pvVar1 = pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanouts).pArray[lVar8]];
          pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
          *(Abc_Obj_t **)((long)pvVar1 + 0x40) = pAVar6;
        }
      }
      iVar3 = pNtk->vBoxes->nSize;
    }
    for (iVar7 = 0; iVar3 = pNtk->vObjs->nSize, iVar7 < iVar3; iVar7 = iVar7 + 1) {
      pAVar5 = Abc_NtkObj(pNtk,iVar7);
      if (pAVar5 != (Abc_Obj_t *)0x0) {
        iVar3 = Abc_NodeIsTravIdCurrent(pAVar5);
        if (iVar3 == 0) {
          Abc_NtkDupObj(pNtk_00,pAVar5,(uint)((*(uint *)&pAVar5->field_0x14 & 0xf) == 6));
        }
      }
    }
    for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
      pAVar5 = Abc_NtkObj(pNtk,iVar7);
      if (pAVar5 != (Abc_Obj_t *)0x0) {
        iVar3 = Abc_NodeIsTravIdCurrent(pAVar5);
        if (iVar3 == 0) {
          for (lVar8 = 0; lVar8 < (pAVar5->vFanins).nSize; lVar8 = lVar8 + 1) {
            Abc_ObjAddFanin((pAVar5->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[lVar8]] +
                             0x40));
          }
        }
      }
      iVar3 = pNtk->vObjs->nSize;
    }
    Abc_NtkIncrementTravId(pNtk);
    iVar7 = 0;
    while( true ) {
      if (pNtk->vCos->nSize <= iVar7) {
        iVar7 = Abc_NtkCheck(pNtk_00);
        if (iVar7 == 0) {
          fwrite("Abc_NtkConvertBlackboxes(): Network check has failed.\n",0x36,1,_stdout);
          Abc_NtkDelete(pNtk_00);
          pNtk_00 = (Abc_Ntk_t *)0x0;
        }
        return pNtk_00;
      }
      pAVar5 = Abc_NtkCo(pNtk,iVar7);
      iVar3 = (pAVar5->vFanouts).nSize;
      if (1 < iVar3) break;
      ppvVar2 = pAVar5->pNtk->vObjs->pArray;
      if ((iVar3 != 1) || ((*(uint *)((long)ppvVar2[*(pAVar5->vFanouts).pArray] + 0x14) & 0xf) != 8)
         ) {
        pAVar5 = (Abc_Obj_t *)ppvVar2[*(pAVar5->vFanins).pArray];
        iVar3 = Abc_NodeIsTravIdCurrent(pAVar5);
        if (iVar3 == 0) {
          Abc_NodeSetTravIdCurrent(pAVar5);
          pAVar6 = Abc_NtkCreatePo(pNtk_00);
          Abc_ObjAddFanin(pAVar6,(pAVar5->field_6).pCopy);
        }
      }
      iVar7 = iVar7 + 1;
    }
    __assert_fail("Abc_ObjFanoutNum(pTerm) <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x28c,"Abc_Ntk_t *Abc_NtkConvertBlackboxes(Abc_Ntk_t *)");
  }
  __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                ,0x25d,"Abc_Ntk_t *Abc_NtkConvertBlackboxes(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkConvertBlackboxes( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNet, * pFanin, * pTerm;
    int i, k;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtk->pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pSpec );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // mark the nodes that should not be connected
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachBlackbox( pNtk, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    Abc_NtkForEachCi( pNtk, pTerm, i )
        Abc_NodeSetTravIdCurrent( pTerm );
    Abc_NtkForEachCo( pNtk, pTerm, i )
        Abc_NodeSetTravIdCurrent( pTerm );
    // unmark PIs and LIs/LOs
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_NodeSetTravIdPrevious( pTerm );
    Abc_NtkForEachLatchInput( pNtk, pTerm, i )
        Abc_NodeSetTravIdPrevious( pTerm );
    Abc_NtkForEachLatchOutput( pNtk, pTerm, i )
        Abc_NodeSetTravIdPrevious( pTerm );
    // copy the box outputs
    Abc_NtkForEachBlackbox( pNtk, pObj, i )
        Abc_ObjForEachFanout( pObj, pTerm, k )
            pTerm->pCopy = Abc_NtkCreatePi( pNtkNew );

    // duplicate other objects
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            Abc_NtkDupObj( pNtkNew, pObj, Abc_ObjIsNet(pObj) );

    // connect all objects
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // create unique PO for each net feeding into blackboxes or POs
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pTerm, i )
    {
        // skip latch inputs
        assert( Abc_ObjFanoutNum(pTerm) <= 1 );
        if ( Abc_ObjFanoutNum(pTerm) > 0 && Abc_ObjIsLatch(Abc_ObjFanout0(pTerm)) )
            continue;
        // check if the net is visited
        pNet = Abc_ObjFanin0(pTerm);
        if ( Abc_NodeIsTravIdCurrent(pNet) )
            continue;
        // create PO
        Abc_NodeSetTravIdCurrent( pNet );
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNtkNew), pNet->pCopy );
    }

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkConvertBlackboxes(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}